

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O2

void __thiscall
gnuplotio::PlotData::
PlotData<std::pair<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>,std::vector<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>,std::allocator<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>>>,gnuplotio::Mode2D,gnuplotio::ModeText>
          (PlotData *this,undefined8 arg,string *_plotspec,string *_arr_or_rec)

{
  ostringstream tmp;
  string local_1c8 [32];
  ostringstream local_1a8 [376];
  
  std::__cxx11::string::string((string *)this,_plotspec);
  this->is_text = true;
  this->is_inline = true;
  this->has_data = true;
  (this->data)._M_dataplus._M_p = (pointer)&(this->data).field_2;
  (this->data)._M_string_length = 0;
  (this->data).field_2._M_local_buf[0] = '\0';
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->arr_or_rec,_arr_or_rec);
  (this->bin_fmt)._M_dataplus._M_p = (pointer)&(this->bin_fmt).field_2;
  (this->bin_fmt)._M_string_length = 0;
  (this->bin_fmt).field_2._M_local_buf[0] = '\0';
  (this->bin_size)._M_dataplus._M_p = (pointer)&(this->bin_size).field_2;
  (this->bin_size)._M_string_length = 0;
  (this->bin_size).field_2._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  handle_colunwrap_tag<2ul,std::pair<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>,std::vector<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>,std::allocator<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>>>,gnuplotio::ModeText>
            (local_1a8,arg);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->data,local_1c8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  if (this->is_text == false) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    handle_colunwrap_tag<2ul,std::pair<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>,std::vector<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>,std::allocator<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>>>,gnuplotio::ModeBinfmt>
              (local_1a8,arg);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->bin_fmt,local_1c8);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    handle_colunwrap_tag<2ul,std::pair<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>,std::vector<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>,std::allocator<std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>>>,gnuplotio::ModeSize>
              (local_1a8,arg);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->bin_size,local_1c8);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  return;
}

Assistant:

PlotData(
        const T &arg,
        const std::string &_plotspec,
        const std::string &_arr_or_rec,
        OrganizationMode, PrintMode
    ) :
        plotspec(_plotspec),
        is_text(PrintMode::is_text),
        is_inline(true),
        has_data(true),
        arr_or_rec(_arr_or_rec)
    {
        {
            std::ostringstream tmp;
            top_level_array_sender(tmp, arg, OrganizationMode(), PrintMode());
            data = tmp.str();
        }

        if(!is_text) {
            try {
                {
                    std::ostringstream tmp;
                    top_level_array_sender(tmp, arg, OrganizationMode(), ModeBinfmt());
                    bin_fmt = tmp.str();
                }
                {
                    std::ostringstream tmp;
                    top_level_array_sender(tmp, arg, OrganizationMode(), ModeSize());
                    bin_size = tmp.str();
                }
            } catch(const plotting_empty_container &) {
                bin_fmt = "";
                bin_size = "0";
            }
        }
    }